

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

void __thiscall cmListFileBacktrace::Entry::~Entry(Entry *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PositionType *pPVar2;
  pointer pcVar3;
  cmState *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  if ((this->Parent).
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pcVar3 = (this->field_0).Context.FilePath._M_dataplus._M_p;
    paVar1 = &(this->field_0).Context.FilePath.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar4 = (this->field_0).Bottom.State;
    pPVar2 = &(this->field_0).Bottom.Position.Position;
    if (pcVar4 != (cmState *)pPVar2) {
      operator_delete(pcVar4,*pPVar2 + 1);
    }
  }
  this_00 = (this->Parent).
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

~Entry()
  {
    if (this->Parent) {
      this->Context.~cmListFileContext();
    } else {
      this->Bottom.~cmStateSnapshot();
    }
  }